

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLimit.cpp
# Opt level: O3

double __thiscall chrono::ChLinkLimit::GetViolation(ChLinkLimit *this,double x)

{
  double dVar1;
  double dVar2;
  
  if ((this->m_active == true) && (this->m_penalty_only == false)) {
    dVar1 = this->m_min;
    dVar2 = this->m_max;
    if ((x <= dVar1) || (dVar2 <= x)) {
      if (x <= dVar1) {
        return x - dVar1;
      }
      if (dVar2 <= x) {
        return x - dVar2;
      }
    }
  }
  return 0.0;
}

Assistant:

double ChLinkLimit::GetViolation(double x) const {
    if (!m_active || m_penalty_only)
        return 0;

    if (x > m_min && x < m_max)
        return 0;
    if (x <= m_min)
        return (x - m_min);
    if (x >= m_max)
        return (x - m_max);

    return 0;
}